

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O3

REF_STATUS ref_inflate_pri_min_dot(REF_NODE ref_node,REF_INT *nodes,REF_DBL *min_dot)

{
  int iVar1;
  int iVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  double dVar10;
  double dVar11;
  REF_DBL top_normal [3];
  REF_DBL edge [3];
  REF_DBL bot_normal [3];
  undefined8 local_98;
  uint local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_68 [4];
  double local_48;
  double local_40;
  double local_38;
  
  local_98 = *(ulong *)nodes;
  local_90 = nodes[2];
  uVar4 = ref_node_tri_normal(ref_node,(REF_INT *)&local_98,&local_48);
  if (uVar4 == 0) {
    uVar4 = ref_math_normalize(&local_48);
    if (uVar4 == 0) {
      local_98 = *(ulong *)(nodes + 3);
      local_90 = nodes[5];
      uVar4 = ref_node_tri_normal(ref_node,(REF_INT *)&local_98,&local_88);
      if (uVar4 == 0) {
        uVar4 = ref_math_normalize(&local_88);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                 ,0x3e,"ref_inflate_pri_min_dot",(ulong)uVar4,"norm top");
          printf("%d %d %d %f %f %f\n",local_88,local_80,local_78,local_98 & 0xffffffff,
                 local_98 >> 0x20,(ulong)local_90);
          pRVar3 = ref_node->real;
          lVar5 = (long)(int)local_98;
          printf("%f %f %f\n",pRVar3[lVar5 * 0xf],pRVar3[lVar5 * 0xf + 1],pRVar3[lVar5 * 0xf + 2]);
          pRVar3 = ref_node->real;
          lVar5 = (long)local_98._4_4_;
          printf("%f %f %f\n",pRVar3[lVar5 * 0xf],pRVar3[lVar5 * 0xf + 1],pRVar3[lVar5 * 0xf + 2]);
          pRVar3 = ref_node->real;
          lVar5 = (long)(int)local_90;
          printf("%f %f %f\n",pRVar3[lVar5 * 0xf],pRVar3[lVar5 * 0xf + 1],pRVar3[lVar5 * 0xf + 2]);
          return uVar4;
        }
        *min_dot = 1.0;
        lVar5 = 0;
        while( true ) {
          pRVar3 = ref_node->real;
          iVar1 = nodes[lVar5 + 3];
          iVar2 = nodes[lVar5];
          lVar7 = 0;
          do {
            local_68[lVar7] = pRVar3[(long)iVar1 * 0xf + lVar7] - pRVar3[(long)iVar2 * 0xf + lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          uVar4 = ref_math_normalize(local_68);
          if (uVar4 != 0) break;
          dVar11 = local_38 * local_68[2] + local_48 * local_68[0] + local_40 * local_68[1];
          dVar10 = *min_dot;
          if (dVar11 <= *min_dot) {
            dVar10 = dVar11;
          }
          dVar11 = local_68[2] * local_78 + local_68[0] * local_88 + local_68[1] * local_80;
          if (dVar11 <= dVar10) {
            dVar10 = dVar11;
          }
          *min_dot = dVar10;
          lVar5 = lVar5 + 1;
          if (lVar5 == 3) {
            return 0;
          }
        }
        uVar8 = (ulong)uVar4;
        pcVar9 = "norm edge0";
        uVar6 = 0x46;
      }
      else {
        uVar8 = (ulong)uVar4;
        pcVar9 = "top";
        uVar6 = 0x31;
      }
    }
    else {
      uVar8 = (ulong)uVar4;
      pcVar9 = "norm bot";
      uVar6 = 0x2c;
    }
  }
  else {
    uVar8 = (ulong)uVar4;
    pcVar9 = "bot";
    uVar6 = 0x2b;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",uVar6,
         "ref_inflate_pri_min_dot",uVar8,pcVar9);
  return (REF_STATUS)uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_pri_min_dot(REF_NODE ref_node, REF_INT *nodes,
                                           REF_DBL *min_dot) {
  REF_INT tri_nodes[3];
  REF_DBL top_normal[3];
  REF_DBL bot_normal[3];
  REF_DBL edge[3];
  REF_INT node, i;

  tri_nodes[0] = nodes[0];
  tri_nodes[1] = nodes[1];
  tri_nodes[2] = nodes[2];
  RSS(ref_node_tri_normal(ref_node, tri_nodes, bot_normal), "bot");
  RSS(ref_math_normalize(bot_normal), "norm bot");

  tri_nodes[0] = nodes[3];
  tri_nodes[1] = nodes[4];
  tri_nodes[2] = nodes[5];
  RSS(ref_node_tri_normal(ref_node, tri_nodes, top_normal), "top");
  RSB(ref_math_normalize(top_normal), "norm top", {
    printf("%d %d %d %f %f %f\n", tri_nodes[0], tri_nodes[1], tri_nodes[2],
           top_normal[0], top_normal[1], top_normal[2]);
    printf("%f %f %f\n", ref_node_xyz(ref_node, 0, tri_nodes[0]),
           ref_node_xyz(ref_node, 1, tri_nodes[0]),
           ref_node_xyz(ref_node, 2, tri_nodes[0]));
    printf("%f %f %f\n", ref_node_xyz(ref_node, 0, tri_nodes[1]),
           ref_node_xyz(ref_node, 1, tri_nodes[1]),
           ref_node_xyz(ref_node, 2, tri_nodes[1]));
    printf("%f %f %f\n", ref_node_xyz(ref_node, 0, tri_nodes[2]),
           ref_node_xyz(ref_node, 1, tri_nodes[2]),
           ref_node_xyz(ref_node, 2, tri_nodes[2]));
  });

  *min_dot = 1.0;
  for (node = 0; node < 3; node++) {
    for (i = 0; i < 3; i++) {
      edge[i] = ref_node_xyz(ref_node, i, nodes[node + 3]) -
                ref_node_xyz(ref_node, i, nodes[node]);
    }
    RSS(ref_math_normalize(edge), "norm edge0");
    *min_dot = MIN(*min_dot, ref_math_dot(edge, bot_normal));
    *min_dot = MIN(*min_dot, ref_math_dot(edge, top_normal));
  }

  return REF_SUCCESS;
}